

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::Print
          (TPZBlockDiagonal<std::complex<float>_> *this,char *msg,ostream *out,
          MatrixOutputFormat format)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (format == EFormatted) {
    std::operator<<(out,"TPZBlockDiagonal matrix ");
    if (msg != (char *)0x0) {
      std::operator<<(out,msg);
    }
    std::endl<char,std::char_traits<char>>(out);
    lVar7 = (this->fBlockSize).fNElements;
    poVar1 = std::operator<<(out,"Number of blocks ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar6 = 0;
    if (lVar7 < 1) {
      lVar7 = lVar6;
    }
    for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
      lVar8 = (long)(this->fBlockSize).fStore[lVar6];
      poVar1 = std::operator<<(out,"block number ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1," size : ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      lVar2 = 0;
      if (0 < lVar8) {
        lVar2 = lVar8;
      }
      lVar4 = (this->fBlockPos).fStore[lVar6] << 3;
      for (lVar3 = 0; lVar5 = lVar4, lVar9 = lVar8, lVar3 != lVar2; lVar3 = lVar3 + 1) {
        while (lVar9 != 0) {
          poVar1 = std::operator<<(out,(complex *)
                                       ((long)&((this->fStorage).fStore)->_M_value + lVar5));
          std::operator<<(poVar1,' ');
          lVar5 = lVar5 + 8;
          lVar9 = lVar9 + -1;
        }
        std::endl<char,std::char_traits<char>>(out);
        lVar4 = lVar4 + lVar8 * 8;
      }
    }
    return;
  }
  TPZMatrix<std::complex<float>_>::Print
            (&this->super_TPZMatrix<std::complex<float>_>,msg,out,format);
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Print(const char *msg, std::ostream &out, const MatrixOutputFormat format) const {
	
	if(format != EFormatted)
	{
		TPZMatrix<TVar>::Print(msg,out,format);
		return;
	}
	out << "TPZBlockDiagonal matrix ";
	if(msg) out << msg;
	out  << std::endl;
	
	int64_t nblock = fBlockSize.NElements();
	out << "Number of blocks " << nblock << std::endl; 
	int64_t b,bsize,pos;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		out << "block number " << b << " size : " << bsize << std::endl;
		int64_t r,c;
		pos = fBlockPos[b];
		for(c=0; c<bsize; c++) {
			for(r=0; r<bsize ; r++) {
				out << fStorage[pos+r+bsize*c] << ' ';
			}
			out << std::endl;
		}
	}
}